

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

RegNum __thiscall
LinearScan::Spill(LinearScan *this,Lifetime *newLifetime,RegOpnd *regOpnd,bool dontSpillCurrent,
                 bool force)

{
  NodeBase **this_00;
  IRType IVar1;
  ushort uVar2;
  BVIndex index;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  RegNum RVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  Type *ppLVar11;
  undefined1 auStack_90 [8];
  EditingIterator iter;
  EditingIterator candidate;
  BitVector local_48;
  uint local_34;
  
  if (regOpnd != (RegOpnd *)0x0 && newLifetime != (Lifetime *)0x0) {
    uVar8 = *(uint *)&newLifetime->field_0x9c;
    IVar1 = (regOpnd->super_Opnd).m_type;
    uVar7 = 1;
    if (IVar1 != TyFloat64) {
      bVar4 = IRType_IsSimd128(IVar1);
      uVar7 = (uint)bVar4;
    }
    if (uVar7 != (uVar8 >> 0xd & 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xac1,
                         "(!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128()))"
                         ,
                         "!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128())"
                        );
      if (!bVar4) goto LAB_0058e32f;
      *puVar10 = 0;
    }
  }
  if (newLifetime == (Lifetime *)0x0) {
    IVar1 = (regOpnd->super_Opnd).m_type;
    uVar8 = 0xffffffff;
    local_34 = 1;
    if (((byte)(IVar1 - TyFloat32) < 2) || (bVar4 = IRType_IsSimd128(IVar1), bVar4)) {
      local_48.word = 0;
      bVar5 = 0;
    }
    else {
      index = TySize[(regOpnd->super_Opnd).m_type];
      BVUnitT<unsigned_long>::AssertRange(index);
      local_48.word = 1L << ((byte)index & 0x3f);
      bVar5 = 0;
      local_34 = 0;
    }
  }
  else {
    uVar2 = *(ushort *)&newLifetime->field_0x9c;
    uVar8 = 0xffffffff;
    if (!force) {
      uVar8 = GetSpillCost(this,newLifetime);
    }
    local_48.word = (newLifetime->intUsageBv).word;
    local_34 = uVar2 >> 0xd & 1;
    bVar5 = (newLifetime->field_0x9c & 4) >> 2;
  }
  iter.super_EditingIterator.last = (NodeBase *)0x0;
  candidate.super_EditingIterator.super_Iterator.list =
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  auStack_90 = (undefined1  [8])this->activeLiveranges;
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)auStack_90;
  bVar4 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                    ((EditingIterator *)auStack_90);
  if (bVar4) {
    do {
      ppLVar11 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)auStack_90);
      uVar9 = GetSpillCost(this,*ppLVar11);
      if ((uVar9 < uVar8) &&
         (RVar6 = (*ppLVar11)->reg, BVUnitT<unsigned_long>::AssertRange((uint)RVar6),
         ((this->instrUseRegs).word >> ((ulong)RVar6 & 0x3f) & 1) == 0)) {
        uVar7 = *(uint *)&(*ppLVar11)->field_0x9c;
        if (((-1 < (char)uVar7) && (local_34 == (uVar7 >> 0xd & 1))) &&
           (((bVar5 == 0 ||
             (RVar6 = (*ppLVar11)->reg, BVUnitT<unsigned_long>::AssertRange((uint)RVar6),
             ((this->calleeSavedRegs).word >> ((ulong)RVar6 & 0x3f) & 1) != 0)) &&
            (bVar4 = LinearScanMD::FitRegIntSizeConstraints
                               (&this->linearScanMD,(*ppLVar11)->reg,local_48), bVar4)))) {
          iter.super_EditingIterator.last = (NodeBase *)auStack_90;
          candidate.super_EditingIterator.super_Iterator.list =
               iter.super_EditingIterator.super_Iterator.list;
          uVar8 = uVar9;
        }
      }
      bVar4 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)auStack_90);
    } while (bVar4);
  }
  if ((newLifetime == (Lifetime *)0x0) &&
     ((candidate.super_EditingIterator.super_Iterator.list ==
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0 ||
      (candidate.super_EditingIterator.super_Iterator.list ==
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)iter.super_EditingIterator.last))
     )) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xaf1,"(newLifetime || candidate.IsValid())",
                       "Didn\'t find anything to spill?!?");
    if (!bVar4) {
LAB_0058e32f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
  }
  if ((candidate.super_EditingIterator.super_Iterator.list ==
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
     (candidate.super_EditingIterator.super_Iterator.list ==
      (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)iter.super_EditingIterator.last))
  {
    if (dontSpillCurrent) {
      return RegNOREG;
    }
  }
  else {
    this_00 = &iter.super_EditingIterator.last;
    ppLVar11 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)this_00);
    newLifetime = *ppLVar11;
    this_01 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
              iter.super_EditingIterator.last[2].next;
    SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrentNode
              ((EditingIterator *)this_00);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (this_01,candidate.super_EditingIterator.super_Iterator.list,0x10);
    RVar6 = newLifetime->reg;
    BVUnitT<unsigned_long>::AssertRange((uint)RVar6);
    RVar6 = RVar6 & (RegXMM15|RegXMM14);
    (this->activeRegs).word =
         (this->activeRegs).word & (-2L << RVar6 | 0xfffffffffffffffeU >> 0x40 - RVar6);
    if ((newLifetime->field_0x9d & 0x20) == 0) {
      this->intRegUsedCount = this->intRegUsedCount - 1;
    }
    else {
      this->floatRegUsedCount = this->floatRegUsedCount - 1;
    }
  }
  RVar6 = SpillLiveRange(this,newLifetime,(Instr *)0x0);
  return RVar6;
}

Assistant:

RegNum
LinearScan::Spill(Lifetime *newLifetime, IR::RegOpnd *regOpnd, bool dontSpillCurrent, bool force)
{
    uint minSpillCost = (uint)-1;

    Assert(!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128()));
    bool isFloatReg;
    BitVector intUsageBV;
    bool needCalleeSaved;

    // For now, we just spill the lifetime with the lowest spill cost.
    if (newLifetime)
    {
        isFloatReg = newLifetime->isFloat;

        if (!force)
        {
            minSpillCost = this->GetSpillCost(newLifetime);
        }
        intUsageBV = newLifetime->intUsageBv;
        needCalleeSaved = newLifetime->isLiveAcrossUserCalls;
    }
    else
    {
        needCalleeSaved = false;
        if (regOpnd->IsFloat() || regOpnd->IsSimd128())
        {
            isFloatReg = true;
        }
        else
        {
            // Filter for int reg size constraints
            isFloatReg = false;
            intUsageBV.ClearAll();
            intUsageBV.Set(TySize[regOpnd->GetType()]);
        }
    }

    SList<Lifetime *>::EditingIterator candidate;
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, lifetime, this->activeLiveranges, iter)
    {
        uint spillCost = this->GetSpillCost(lifetime);
        if (spillCost < minSpillCost                        &&
            this->instrUseRegs.Test(lifetime->reg) == false &&
            lifetime->isFloat == isFloatReg &&
            !lifetime->cantSpill                            &&
            (!needCalleeSaved || this->calleeSavedRegs.Test(lifetime->reg)) &&
            this->linearScanMD.FitRegIntSizeConstraints(lifetime->reg, intUsageBV))
        {
            minSpillCost = spillCost;
            candidate = iter;
        }
    } NEXT_SLIST_ENTRY_EDITING;
    AssertMsg(newLifetime || candidate.IsValid(), "Didn't find anything to spill?!?");

    Lifetime * spilledRange;
    if (candidate.IsValid())
    {
        spilledRange = candidate.Data();
        candidate.RemoveCurrent();

        this->activeRegs.Clear(spilledRange->reg);
        if (spilledRange->IsInt())
        {
            this->intRegUsedCount--;
        }
        else
        {
            this->floatRegUsedCount--;
        }
    }
    else if (dontSpillCurrent)
    {
        return RegNOREG;
    }
    else
    {
        spilledRange = newLifetime;
    }

    return this->SpillLiveRange(spilledRange);
}